

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O0

CURLMcode curl_multi_perform(Curl_multi *multi,int *running_handles)

{
  _Bool _Var1;
  Curl_tree *pCVar2;
  Curl_easy *d;
  curltime cVar3;
  curltime now_00;
  CURLcode local_110;
  _Bool local_109;
  CURLcode result_unused;
  _Bool stream_unused;
  Curl_easy *data_1;
  Curl_easy *pCStack_f8;
  CURLMcode result;
  Curl_easy *data;
  sigpipe_ignore pipe_st;
  Curl_llist_node *n;
  Curl_llist_node *e;
  curltime now;
  Curl_tree *t;
  CURLMcode returncode;
  int *running_handles_local;
  Curl_multi *multi_local;
  
  t._4_4_ = CURLM_OK;
  now.tv_usec = 0;
  now._12_4_ = 0;
  cVar3 = Curl_now();
  e = (Curl_llist_node *)cVar3.tv_sec;
  now.tv_sec._0_4_ = cVar3.tv_usec;
  pipe_st.no_signal = false;
  pipe_st._153_7_ = 0;
  if ((multi == (Curl_multi *)0x0) || (multi->magic != 0xbab1e)) {
    multi_local._4_4_ = CURLM_BAD_HANDLE;
  }
  else if (((byte)multi->field_0x279 >> 2 & 1) == 0) {
    sigpipe_init((sigpipe_ignore *)&data);
    n = Curl_llist_head(&multi->process);
    while (n != (Curl_llist_node *)0x0) {
      pCStack_f8 = (Curl_easy *)Curl_node_elem(n);
      pipe_st._152_8_ = Curl_node_next(n);
      if (pCStack_f8 != (multi->cpool).idata) {
        sigpipe_apply(pCStack_f8,(sigpipe_ignore *)&data);
        data_1._4_4_ = multi_runsingle(multi,(curltime *)&e,pCStack_f8);
        if (data_1._4_4_ != CURLM_OK) {
          t._4_4_ = data_1._4_4_;
        }
      }
      n = (Curl_llist_node *)pipe_st._152_8_;
    }
    sigpipe_apply((multi->cpool).idata,(sigpipe_ignore *)&data);
    Curl_cpool_multi_perform(multi);
    sigpipe_restore((sigpipe_ignore *)&data);
    do {
      cVar3.tv_usec = (int)now.tv_sec;
      cVar3.tv_sec = (time_t)e;
      cVar3._12_4_ = 0;
      pCVar2 = Curl_splaygetbest(cVar3,multi->timetree,(Curl_tree **)&now.tv_usec);
      multi->timetree = pCVar2;
      if (now._8_8_ != 0) {
        _result_unused = (Curl_easy *)Curl_splayget((Curl_tree *)now._8_8_);
        if ((_result_unused->mstate == MSTATE_PENDING) &&
           (_Var1 = multi_handle_timeout(_result_unused,(curltime *)&e,&local_109,&local_110), _Var1
           )) {
          if (((_result_unused != (Curl_easy *)0x0) &&
              ((*(ulong *)&(_result_unused->set).field_0x8ca >> 0x1c & 1) != 0)) &&
             (((_result_unused->state).feat == (curl_trc_feat *)0x0 ||
              (0 < ((_result_unused->state).feat)->log_level)))) {
            Curl_infof(_result_unused,"PENDING handle timeout");
          }
          move_pending_to_connect(multi,_result_unused);
        }
        d = (Curl_easy *)Curl_splayget((Curl_tree *)now._8_8_);
        now_00.tv_usec = (int)now.tv_sec;
        now_00.tv_sec = (time_t)e;
        now_00._12_4_ = 0;
        add_next_timeout(now_00,multi,d);
      }
    } while (now._8_8_ != 0);
    if (running_handles != (int *)0x0) {
      *running_handles = multi->num_alive;
    }
    if (t._4_4_ < CURLM_BAD_HANDLE) {
      t._4_4_ = Curl_update_timer(multi);
    }
    multi_local._4_4_ = t._4_4_;
  }
  else {
    multi_local._4_4_ = CURLM_RECURSIVE_API_CALL;
  }
  return multi_local._4_4_;
}

Assistant:

CURLMcode curl_multi_perform(struct Curl_multi *multi, int *running_handles)
{
  CURLMcode returncode = CURLM_OK;
  struct Curl_tree *t = NULL;
  struct curltime now = Curl_now();
  struct Curl_llist_node *e;
  struct Curl_llist_node *n = NULL;
  SIGPIPE_VARIABLE(pipe_st);

  if(!GOOD_MULTI_HANDLE(multi))
    return CURLM_BAD_HANDLE;

  if(multi->in_callback)
    return CURLM_RECURSIVE_API_CALL;

  sigpipe_init(&pipe_st);
  for(e = Curl_llist_head(&multi->process); e; e = n) {
    struct Curl_easy *data = Curl_node_elem(e);
    CURLMcode result;
    /* Do the loop and only alter the signal ignore state if the next handle
       has a different NO_SIGNAL state than the previous */

    /* the current node might be unlinked in multi_runsingle(), get the next
       pointer now */
    n = Curl_node_next(e);

    if(data != multi->cpool.idata) {
      /* connection pool handle is processed below */
      sigpipe_apply(data, &pipe_st);
      result = multi_runsingle(multi, &now, data);
      if(result)
        returncode = result;
    }
  }

  sigpipe_apply(multi->cpool.idata, &pipe_st);
  Curl_cpool_multi_perform(multi);

  sigpipe_restore(&pipe_st);

  /*
   * Simply remove all expired timers from the splay since handles are dealt
   * with unconditionally by this function and curl_multi_timeout() requires
   * that already passed/handled expire times are removed from the splay.
   *
   * It is important that the 'now' value is set at the entry of this function
   * and not for the current time as it may have ticked a little while since
   * then and then we risk this loop to remove timers that actually have not
   * been handled!
   */
  do {
    multi->timetree = Curl_splaygetbest(now, multi->timetree, &t);
    if(t) {
      /* the removed may have another timeout in queue */
      struct Curl_easy *data = Curl_splayget(t);
      if(data->mstate == MSTATE_PENDING) {
        bool stream_unused;
        CURLcode result_unused;
        if(multi_handle_timeout(data, &now, &stream_unused, &result_unused)) {
          infof(data, "PENDING handle timeout");
          move_pending_to_connect(multi, data);
        }
      }
      (void)add_next_timeout(now, multi, Curl_splayget(t));
    }
  } while(t);

  if(running_handles)
    *running_handles = (int)multi->num_alive;

  if(CURLM_OK >= returncode)
    returncode = Curl_update_timer(multi);

  return returncode;
}